

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Layer.cpp
# Opt level: O3

int __thiscall
CLayer::GetNetInOverFlowBoundary
          (CLayer *this,
          hash_map<long_long,_int,___gnu_cxx::hash<long_long>,_std::equal_to<long_long>,_std::allocator<int>_>
          *pNetList)

{
  CBoundary *this_00;
  pointer ppCVar1;
  int iVar2;
  reference pvVar3;
  pointer ppCVar4;
  value_type local_50;
  _Base_ptr local_40;
  _Rb_tree_node_base *local_38;
  
  local_38 = (this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_40 = &(this->m_CBoundaryBucket)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (local_38 != local_40) {
    do {
      this_00 = (CBoundary *)local_38[1]._M_parent;
      ppCVar1 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppCVar4 = (this_00->m_Wire).super__Vector_base<CWire_*,_std::allocator<CWire_*>_>._M_impl
                     .super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
        iVar2 = CBoundary::GetCongestion(this_00);
        local_50.first = (longlong)((*ppCVar4)->super_CObject).m_pParent;
        local_50.second = 0;
        pvVar3 = __gnu_cxx::
                 hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::find_or_insert(&pNetList->_M_ht,&local_50);
        if (pvVar3->second < iVar2) {
          iVar2 = CBoundary::GetCongestion(this_00);
        }
        else {
          local_50.first = (longlong)((*ppCVar4)->super_CObject).m_pParent;
          local_50.second = 0;
          pvVar3 = __gnu_cxx::
                   hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                   ::find_or_insert(&pNetList->_M_ht,&local_50);
          iVar2 = pvVar3->second;
        }
        local_50.first = (longlong)((*ppCVar4)->super_CObject).m_pParent;
        local_50.second = 0;
        pvVar3 = __gnu_cxx::
                 hashtable<std::pair<const_long_long,_int>,_long_long,___gnu_cxx::hash<long_long>,_std::_Select1st<std::pair<const_long_long,_int>_>,_std::equal_to<long_long>,_std::allocator<int>_>
                 ::find_or_insert(&pNetList->_M_ht,&local_50);
        pvVar3->second = iVar2;
      }
      local_38 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_38);
    } while (local_38 != local_40);
  }
  return (int)(pNetList->_M_ht)._M_num_elements;
}

Assistant:

int CLayer::GetNetInOverFlowBoundary(hash_map<ADDRESS,int>* pNetList)
{
	for(multimap<int, CBoundary*>::iterator itr=m_CBoundaryBucket.begin(),end=m_CBoundaryBucket.end();itr!=end;++itr)
	{
		vector<CNet*>	NetList;
		CBoundary*	pBoundary	=	itr->second;

		for(vector<CWire*>::iterator itrw=pBoundary->m_Wire.begin(),end=pBoundary->m_Wire.end();itrw!=end;++itrw)
		{
			(*pNetList)[(ADDRESS)(*itrw)->GetParent()]	=	MAX(pBoundary->GetCongestion(),(*pNetList)[(ADDRESS)(*itrw)->GetParent()]);
		}
	}

	return	pNetList->size();
}